

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall
wabt::TypeChecker::PopAndCheck3Types
          (TypeChecker *this,Type expected1,Type expected2,Type expected3,char *desc)

{
  bool bVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  
  RVar2 = PeekAndCheckType(this,0,expected3);
  RVar3 = PeekAndCheckType(this,1,expected2);
  RVar4 = PeekAndCheckType(this,2,expected1);
  bVar1 = RVar4.enum_ == Error || (RVar3.enum_ == Error || RVar2.enum_ == Error);
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = bVar1;
  PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type>
            (this,RVar2,desc,expected1,expected2,expected3);
  RVar2 = DropTypes(this,3);
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = bVar1 || RVar2.enum_ == Error;
  return (Result)RVar3.enum_;
}

Assistant:

Result TypeChecker::PopAndCheck3Types(Type expected1,
                                      Type expected2,
                                      Type expected3,
                                      const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected3);
  result |= PeekAndCheckType(1, expected2);
  result |= PeekAndCheckType(2, expected1);
  PrintStackIfFailed(result, desc, expected1, expected2, expected3);
  result |= DropTypes(3);
  return result;
}